

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O2

int __thiscall FormatTypeEDSK::GetNbRevolutions(FormatTypeEDSK *this,int side,int track)

{
  uint uVar1;
  Track *pTVar2;
  Sector *pSVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  pTVar2 = this->side_[side].tracks;
  uVar1 = pTVar2[track].nb_sector;
  uVar7 = 1;
  for (lVar8 = 0; (ulong)uVar1 * 0x1d0 - lVar8 != 0; lVar8 = lVar8 + 0x1d0) {
    pSVar3 = pTVar2[track].sectors;
    uVar5 = (uint)*(ushort *)(pSVar3->mfm_chrn + lVar8 + -0x12);
    uVar4 = 0x80 << (pSVar3->mfm_chrn[lVar8 + -0x15] & 0x1f);
    if (0x18 < pSVar3->mfm_chrn[lVar8 + -0x15]) {
      uVar4 = uVar5;
    }
    uVar6 = uVar5 / uVar4;
    if (uVar5 % uVar4 != 0) {
      uVar6 = 1;
    }
    *(uint *)(pSVar3->mfm_crc + lVar8 + 0x3c) = uVar6;
    if (uVar7 < uVar6) {
      uVar7 = uVar6;
    }
  }
  return uVar7;
}

Assistant:

int FormatTypeEDSK::GetNbRevolutions(int side, int track)
{
   unsigned int nb_computed_revolution = 1;
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;
      unsigned int theorical_size = (0x80 << (side_[side].tracks[track].sectors[s].sector_size));

      // Do we have multiple read ?
      if (theorical_size == 0) theorical_size = size_of_track;

      unsigned int nb_read = (size_of_track / theorical_size);

      if (size_of_track % theorical_size != 0)
         nb_read = 1;

      side_[side].tracks[track].sectors[s].nb_recorded_revolutions = nb_read;
      if (nb_read > nb_computed_revolution) nb_computed_revolution = nb_read;
   }
   return nb_computed_revolution;
}